

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

SimpleString __thiscall
CommandLineArguments::getParameterField
          (CommandLineArguments *this,int ac,char **av,int *i,SimpleString *parameterName)

{
  size_t sVar1;
  size_t sVar2;
  int in_EDX;
  size_t extraout_RDX;
  SimpleString *in_RDI;
  int *in_R8;
  SimpleString SVar3;
  SimpleString parameter;
  size_t parameterLength;
  SimpleString *this_00;
  
  this_00 = in_RDI;
  sVar1 = SimpleString::size((SimpleString *)0x125787);
  SimpleString::SimpleString(this_00,(char *)in_RDI);
  sVar2 = SimpleString::size((SimpleString *)0x1257b6);
  if (sVar1 < sVar2) {
    SimpleString::SimpleString(this_00,(char *)in_RDI);
  }
  else if (*in_R8 + 1 < in_EDX) {
    *in_R8 = *in_R8 + 1;
    SimpleString::SimpleString(this_00,(char *)in_RDI);
  }
  else {
    SimpleString::SimpleString(this_00,(char *)in_RDI);
  }
  SimpleString::~SimpleString((SimpleString *)0x125874);
  SVar3.bufferSize_ = extraout_RDX;
  SVar3.buffer_ = (char *)this_00;
  return SVar3;
}

Assistant:

SimpleString CommandLineArguments::getParameterField(int ac, const char * const *av, int& i, const SimpleString& parameterName)
{
    size_t parameterLength = parameterName.size();
    SimpleString parameter(av[i]);
    if (parameter.size() >  parameterLength) return av[i] + parameterLength;
    else if (i + 1 < ac) return av[++i];
    return "";
}